

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall cmMakefile::Configure(cmMakefile *this)

{
  cmStateSnapshot *this_00;
  cmListFileBacktrace *value;
  _Base_ptr p_Var1;
  cmake *pcVar2;
  cmDebuggerAdapter *this_01;
  char *pcVar3;
  int *piVar4;
  undefined1 auVar5 [16];
  undefined8 uVar6;
  undefined8 uVar7;
  bool bVar8;
  cmListFileFunction *func_2;
  string *psVar9;
  const_iterator cVar10;
  pointer __p;
  cmListFileFunction *func;
  element_type *peVar11;
  cmListFileFunction *func_1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  pointer pcVar13;
  long lVar14;
  element_type *peVar15;
  long *plVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<cmListFileArgument> __l;
  string_view value_00;
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> subdirs;
  cmListFile listFile;
  string currentStart;
  string filesDir;
  BuildsystemFileScope scope;
  undefined1 local_268 [16];
  undefined1 local_258 [31];
  undefined1 local_239;
  undefined1 local_238 [17];
  undefined7 uStack_227;
  undefined8 uStack_220;
  _Base_ptr local_218;
  size_t local_210;
  long *local_208;
  undefined8 local_200;
  long local_1f8;
  undefined8 uStack_1f0;
  undefined4 local_1e8;
  undefined8 local_1e0;
  undefined1 local_1d8 [16];
  pointer local_1c8;
  long *local_1b8;
  undefined8 local_1b0;
  undefined1 local_1a8;
  undefined7 uStack_1a7;
  undefined8 uStack_1a0;
  element_type *local_198;
  char *local_190;
  undefined1 local_188 [72];
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_140;
  string local_120;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> local_100;
  long local_e8 [2];
  BuildsystemFileScope local_d8;
  cmListFileContext local_a0;
  
  this_00 = &this->StateSnapshot;
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&local_d8,this_00);
  psVar9 = cmStateDirectory::GetCurrentSource_abi_cxx11_((cmStateDirectory *)&local_d8);
  local_238._8_8_ = (psVar9->_M_dataplus)._M_p;
  local_238._0_8_ = psVar9->_M_string_length;
  stack0xfffffffffffffdd8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  uStack_220 = 0xf;
  local_218 = (_Base_ptr)0x7cdce8;
  local_210 = 0;
  views._M_len = 2;
  views._M_array = (iterator)local_238;
  cmCatViews((string *)(local_188 + 0x10),views);
  cmListFileContext::FromListFilePath(&local_a0,(string *)(local_188 + 0x10));
  value = &this->Backtrace;
  cmConstStack<cmListFileContext,_cmListFileBacktrace>::Push
            ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)local_238,
             (cmListFileContext *)value);
  uVar7 = local_238._8_8_;
  uVar6 = local_238._0_8_;
  local_238._0_8_ = 0;
  local_238._8_8_ = (char *)0x0;
  p_Var12 = (this->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  (this->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)uVar6;
  (this->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7;
  if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_);
    }
  }
  if ((local_a0.DeferId.
       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._M_engaged == true) &&
     (local_a0.DeferId.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false,
     local_a0.DeferId.
     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
     ._M_payload.
     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
     .
     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     ._M_payload._M_value._M_dataplus._M_p !=
     ((pointer)
     ((long)&local_a0.DeferId.
             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     + 0x10U))._M_p)) {
    operator_delete((void *)local_a0.DeferId.
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload._M_value._M_dataplus._M_p,
                    local_a0.DeferId.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_payload._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.FilePath._M_dataplus._M_p != &local_a0.FilePath.field_2) {
    operator_delete(local_a0.FilePath._M_dataplus._M_p,
                    local_a0.FilePath.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.Name._M_dataplus._M_p != &local_a0.Name.field_2) {
    operator_delete(local_a0.Name._M_dataplus._M_p,local_a0.Name.field_2._M_allocated_capacity + 1);
  }
  BuildsystemFileScope::BuildsystemFileScope(&local_d8,this);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_268,this_00);
  psVar9 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)local_268);
  local_238._8_8_ = (psVar9->_M_dataplus)._M_p;
  local_238._0_8_ = psVar9->_M_string_length;
  stack0xfffffffffffffdd8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  uStack_220 = (_Base_ptr)0xb;
  local_218 = (_Base_ptr)0x7cdcf8;
  local_210 = 0;
  views_00._M_len = 2;
  views_00._M_array = (iterator)local_238;
  cmCatViews(&local_120,views_00);
  cmsys::SystemTools::MakeDirectory(&local_120,(mode_t *)0x0);
  bVar8 = cmsys::SystemTools::FileExists((string *)(local_188 + 0x10),true);
  if (!bVar8) {
    __assert_fail("cmSystemTools::FileExists(currentStart, true)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmMakefile.cxx"
                  ,0x6d6,"void cmMakefile::Configure()");
  }
  local_238._0_8_ = (element_type *)(local_238 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"CMAKE_PARENT_LIST_FILE","");
  value_00._M_str = (char *)local_188._16_8_;
  value_00._M_len = local_188._24_8_;
  AddDefinition(this,(string *)local_238,value_00);
  if ((element_type *)local_238._0_8_ != (element_type *)(local_238 + 0x10)) {
    operator_delete((void *)local_238._0_8_,(ulong)(stack0xfffffffffffffdd8 + 1));
  }
  pcVar2 = this->GlobalGenerator->CMakeInstance;
  peVar11 = (pcVar2->DebugAdapter).
            super___shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var12 = (pcVar2->DebugAdapter).
            super___shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (p_Var12 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (peVar11 != (element_type *)0x0) {
LAB_001e9db1:
      bVar8 = true;
      p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      goto LAB_001e9dc0;
    }
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
    if (peVar11 != (element_type *)0x0) {
      pcVar2 = this->GlobalGenerator->CMakeInstance;
      peVar11 = (pcVar2->DebugAdapter).
                super___shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      p_Var12 = (pcVar2->DebugAdapter).
                super___shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (p_Var12 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_001e9db1;
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
      }
      bVar8 = false;
LAB_001e9dc0:
      cmDebugger::cmDebuggerAdapter::OnBeginFileParse(peVar11,this,(string *)(local_188 + 0x10));
      if (!bVar8) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
      }
    }
  }
  local_1d8 = (undefined1  [16])0x0;
  local_1c8 = (pointer)0x0;
  bVar8 = cmListFile::ParseFile
                    ((cmListFile *)local_1d8,(char *)local_188._16_8_,
                     (this->GlobalGenerator->CMakeInstance->Messenger)._M_t.
                     super___uniq_ptr_impl<cmMessenger,_std::default_delete<cmMessenger>_>._M_t.
                     super__Tuple_impl<0UL,_cmMessenger_*,_std::default_delete<cmMessenger>_>.
                     super__Head_base<0UL,_cmMessenger_*,_false>._M_head_impl,value);
  pcVar2 = this->GlobalGenerator->CMakeInstance;
  peVar11 = (pcVar2->DebugAdapter).
            super___shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var12 = (pcVar2->DebugAdapter).
            super___shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (!bVar8) {
    if (p_Var12 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (peVar11 == (element_type *)0x0) goto LAB_001ea791;
LAB_001e9f09:
      bVar8 = true;
      p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
      if (peVar11 == (element_type *)0x0) goto LAB_001ea791;
      pcVar2 = this->GlobalGenerator->CMakeInstance;
      peVar11 = (pcVar2->DebugAdapter).
                super___shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      p_Var12 = (pcVar2->DebugAdapter).
                super___shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (p_Var12 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_001e9f09;
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
      }
      bVar8 = false;
    }
    cmDebugger::cmDebuggerAdapter::OnEndFileParse(peVar11);
    if (!bVar8) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
    }
    goto LAB_001ea791;
  }
  if (p_Var12 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (peVar11 != (element_type *)0x0) {
LAB_001e9ebe:
      bVar8 = true;
      p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      goto LAB_001e9f1b;
    }
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
    if (peVar11 != (element_type *)0x0) {
      pcVar2 = this->GlobalGenerator->CMakeInstance;
      peVar11 = (pcVar2->DebugAdapter).
                super___shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      p_Var12 = (pcVar2->DebugAdapter).
                super___shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (p_Var12 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_001e9ebe;
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
      }
      bVar8 = false;
LAB_001e9f1b:
      cmDebugger::cmDebuggerAdapter::OnEndFileParse(peVar11);
      if (!bVar8) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
      }
      pcVar2 = this->GlobalGenerator->CMakeInstance;
      this_01 = (pcVar2->DebugAdapter).
                super___shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      p_Var12 = (pcVar2->DebugAdapter).
                super___shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
        }
      }
      cmDebugger::cmDebuggerAdapter::OnFileParsedSuccessfully
                (this_01,(string *)(local_188 + 0x10),
                 (vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)local_1d8);
      if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
      }
    }
  }
  cmStateSnapshot::GetBuildsystemDirectoryParent((cmStateSnapshot *)local_238,this_00);
  bVar8 = cmStateSnapshot::IsValid((cmStateSnapshot *)local_238);
  if (!bVar8) {
    for (pcVar13 = (pointer)local_1d8._0_8_; pcVar13 != (pointer)local_1d8._8_8_;
        pcVar13 = pcVar13 + 1) {
      lVar14 = (long)(pcVar13->Impl).
                     super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
      if (*(long *)(lVar14 + 0x28) == 0x16) {
        pcVar3 = *(char **)(lVar14 + 0x20);
        auVar17[0] = -(*pcVar3 == 'c');
        auVar17[1] = -(pcVar3[1] == 'm');
        auVar17[2] = -(pcVar3[2] == 'a');
        auVar17[3] = -(pcVar3[3] == 'k');
        auVar17[4] = -(pcVar3[4] == 'e');
        auVar17[5] = -(pcVar3[5] == '_');
        auVar17[6] = -(pcVar3[6] == 'm');
        auVar17[7] = -(pcVar3[7] == 'i');
        auVar17[8] = -(pcVar3[8] == 'n');
        auVar17[9] = -(pcVar3[9] == 'i');
        auVar17[10] = -(pcVar3[10] == 'm');
        auVar17[0xb] = -(pcVar3[0xb] == 'u');
        auVar17[0xc] = -(pcVar3[0xc] == 'm');
        auVar17[0xd] = -(pcVar3[0xd] == '_');
        auVar17[0xe] = -(pcVar3[0xe] == 'r');
        auVar17[0xf] = -(pcVar3[0xf] == 'e');
        auVar18[0] = -(pcVar3[6] == 'm');
        auVar18[1] = -(pcVar3[7] == 'i');
        auVar18[2] = -(pcVar3[8] == 'n');
        auVar18[3] = -(pcVar3[9] == 'i');
        auVar18[4] = -(pcVar3[10] == 'm');
        auVar18[5] = -(pcVar3[0xb] == 'u');
        auVar18[6] = -(pcVar3[0xc] == 'm');
        auVar18[7] = -(pcVar3[0xd] == '_');
        auVar18[8] = -(pcVar3[0xe] == 'r');
        auVar18[9] = -(pcVar3[0xf] == 'e');
        auVar18[10] = -(pcVar3[0x10] == 'q');
        auVar18[0xb] = -(pcVar3[0x11] == 'u');
        auVar18[0xc] = -(pcVar3[0x12] == 'i');
        auVar18[0xd] = -(pcVar3[0x13] == 'r');
        auVar18[0xe] = -(pcVar3[0x14] == 'e');
        auVar18[0xf] = -(pcVar3[0x15] == 'd');
        auVar18 = auVar18 & auVar17;
        if ((ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar18[0xf] >> 7) << 0xf) == 0xffff) goto LAB_001ea3b0;
      }
    }
    if ((ulong)(local_1d8._8_8_ - local_1d8._0_8_) < 0x1e0) {
      p_Var1 = (_Base_ptr)(local_238 + 8);
      local_238._8_4_ = 0;
      stack0xfffffffffffffdd8 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_210 = 0;
      local_268._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_258;
      uStack_220 = p_Var1;
      local_218 = p_Var1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"project","");
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)local_238,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268);
      if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_268._0_8_ !=
          (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_258) {
        operator_delete((void *)local_268._0_8_,(ulong)(local_258._0_8_ + 1));
      }
      local_268._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_258;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"set","");
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)local_238,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268);
      if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_268._0_8_ !=
          (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_258) {
        operator_delete((void *)local_268._0_8_,(ulong)(local_258._0_8_ + 1));
      }
      local_268._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_258;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"if","");
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)local_238,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268);
      if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_268._0_8_ !=
          (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_258) {
        operator_delete((void *)local_268._0_8_,(ulong)(local_258._0_8_ + 1));
      }
      local_268._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_258;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"endif","");
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)local_238,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268);
      if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_268._0_8_ !=
          (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_258) {
        operator_delete((void *)local_268._0_8_,(ulong)(local_258._0_8_ + 1));
      }
      local_268._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_258;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"else","");
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)local_238,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268);
      if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_268._0_8_ !=
          (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_258) {
        operator_delete((void *)local_268._0_8_,(ulong)(local_258._0_8_ + 1));
      }
      local_268._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_258;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"elseif","");
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)local_238,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268);
      if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_268._0_8_ !=
          (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_258) {
        operator_delete((void *)local_268._0_8_,(ulong)(local_258._0_8_ + 1));
      }
      local_268._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_258;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"add_executable","");
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)local_238,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268);
      if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_268._0_8_ !=
          (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_258) {
        operator_delete((void *)local_268._0_8_,(ulong)(local_258._0_8_ + 1));
      }
      local_268._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_258;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"add_library","");
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)local_238,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268);
      if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_268._0_8_ !=
          (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_258) {
        operator_delete((void *)local_268._0_8_,(ulong)(local_258._0_8_ + 1));
      }
      local_268._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_258;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_268,"target_link_libraries","");
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)local_238,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268);
      if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_268._0_8_ !=
          (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_258) {
        operator_delete((void *)local_268._0_8_,(ulong)(local_258._0_8_ + 1));
      }
      local_268._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_258;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"option","");
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)local_238,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268);
      if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_268._0_8_ !=
          (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_258) {
        operator_delete((void *)local_268._0_8_,(ulong)(local_258._0_8_ + 1));
      }
      local_268._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_258;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"message","");
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)local_238,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268);
      if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_268._0_8_ !=
          (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_258) {
        operator_delete((void *)local_268._0_8_,(ulong)(local_258._0_8_ + 1));
      }
      uVar6 = local_1d8._8_8_;
      if (local_1d8._0_8_ != local_1d8._8_8_) {
        pcVar13 = (pointer)local_1d8._0_8_;
        do {
          cVar10 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_238,
                          (key_type *)
                          ((long)(pcVar13->Impl).
                                 super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr + 0x20));
          if (cVar10._M_node == p_Var1) {
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_238);
            goto LAB_001ea392;
          }
          pcVar13 = pcVar13 + 1;
        } while (pcVar13 != (pointer)uVar6);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_238);
    }
    else {
LAB_001ea392:
      this->CheckCMP0000 = true;
      cmPolicies::ApplyPolicyVersion(this,2,4,0,Off);
    }
LAB_001ea3b0:
    peVar15 = (element_type *)(local_238 + 0x10);
    for (pcVar13 = (pointer)local_1d8._0_8_; pcVar13 != (pointer)local_1d8._8_8_;
        pcVar13 = pcVar13 + 1) {
      lVar14 = (long)(pcVar13->Impl).
                     super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
      if ((*(long *)(lVar14 + 0x28) == 7) &&
         (piVar4 = *(int **)(lVar14 + 0x20),
         *(int *)((long)piVar4 + 3) == 0x7463656a && *piVar4 == 0x6a6f7270)) goto LAB_001ea6ae;
    }
    pcVar2 = this->GlobalGenerator->CMakeInstance;
    local_238._0_8_ = peVar15;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_238,
               "No project() command is present.  The top-level CMakeLists.txt file must contain a literal, direct call to the project() command.  Add a line of code such as\n  project(ProjectName)\nnear the top of the file, but after cmake_minimum_required().\nCMake is pretending there is a \"project(Project)\" command on the first line."
               ,"");
    cmake::IssueMessage(pcVar2,AUTHOR_WARNING,(string *)local_238,value);
    if ((element_type *)local_238._0_8_ != peVar15) {
      operator_delete((void *)local_238._0_8_,(ulong)(stack0xfffffffffffffdd8 + 1));
    }
    local_140._M_value._M_dataplus._M_p = (_Alloc_hider)(local_188 + 0x58);
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_188 + 0x48),"project","");
    local_198 = (element_type *)local_188;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"Project","");
    if (local_198 == (element_type *)local_188) {
      uStack_220 = local_188._8_8_;
      local_198 = peVar15;
    }
    uStack_227 = local_188._1_7_;
    local_238[0x10] = local_188[0];
    local_238._8_8_ = local_190;
    local_238._0_8_ = local_198;
    local_190 = (char *)0x0;
    local_188[0] = 0;
    local_218 = (_Base_ptr)((ulong)local_218 & 0xffffffff00000000);
    local_210 = 0;
    local_1b8 = (long *)&local_1a8;
    local_198 = (element_type *)local_188;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1b8,"__CMAKE_INJECTED_PROJECT_COMMAND__","");
    plVar16 = &local_1f8;
    if (local_1b8 == (long *)&local_1a8) {
      uStack_1f0 = uStack_1a0;
      local_208 = plVar16;
    }
    else {
      local_208 = local_1b8;
    }
    local_200 = local_1b0;
    local_1b0 = 0;
    local_1a8 = 0;
    local_1e8 = 0;
    local_1e0 = 0;
    __l._M_len = 2;
    __l._M_array = (iterator)local_238;
    local_1b8 = (long *)&local_1a8;
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::vector
              (&local_100,__l,(allocator_type *)(local_258 + 0x1e));
    local_e8[1] = 0;
    local_e8[0] = 0;
    local_268._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<cmListFileFunction::Implementation,std::allocator<cmListFileFunction::Implementation>,std::__cxx11::string,long&,long&,std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_268 + 8),
               (Implementation **)local_268,
               (allocator<cmListFileFunction::Implementation> *)&local_239,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_188 + 0x48),local_e8 + 1,local_e8,&local_100);
    local_188._48_8_ = local_268._0_8_;
    local_188._56_8_ = local_268._8_8_;
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector(&local_100);
    lVar14 = -0x60;
    do {
      if (plVar16 != (long *)plVar16[-2]) {
        operator_delete((long *)plVar16[-2],*plVar16 + 1);
      }
      plVar16 = plVar16 + -6;
      lVar14 = lVar14 + 0x30;
    } while (lVar14 != 0);
    if (local_1b8 != (long *)&local_1a8) {
      operator_delete(local_1b8,CONCAT71(uStack_1a7,local_1a8) + 1);
    }
    if (local_198 != (element_type *)local_188) {
      operator_delete(local_198,CONCAT71(local_188._1_7_,local_188[0]) + 1);
    }
    if (local_140._M_value._M_dataplus._M_p != (_Alloc_hider)(local_188 + 0x58)) {
      operator_delete((void *)local_140._M_value._M_dataplus._M_p,local_140._16_8_ + 1);
    }
    std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::insert
              ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)local_1d8,
               (const_iterator)local_1d8._0_8_,(value_type *)(local_188 + 0x30));
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._56_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._56_8_);
    }
  }
LAB_001ea6ae:
  __p = (pointer)operator_new(0x18);
  (__p->Commands).
  super__Vector_base<cmMakefile::DeferCommand,_std::allocator<cmMakefile::DeferCommand>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->Commands).
  super__Vector_base<cmMakefile::DeferCommand,_std::allocator<cmMakefile::DeferCommand>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p->Commands).
  super__Vector_base<cmMakefile::DeferCommand,_std::allocator<cmMakefile::DeferCommand>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_238._8_8_;
  local_238._0_16_ = auVar5 << 0x40;
  std::__uniq_ptr_impl<cmMakefile::DeferCommands,_std::default_delete<cmMakefile::DeferCommands>_>::
  reset((__uniq_ptr_impl<cmMakefile::DeferCommands,_std::default_delete<cmMakefile::DeferCommands>_>
         *)&this->Defer,__p);
  std::unique_ptr<cmMakefile::DeferCommands,_std::default_delete<cmMakefile::DeferCommands>_>::
  ~unique_ptr((unique_ptr<cmMakefile::DeferCommands,_std::default_delete<cmMakefile::DeferCommands>_>
               *)local_238);
  RunListFile(this,(cmListFile *)local_1d8,(string *)(local_188 + 0x10),
              (this->Defer)._M_t.
              super___uniq_ptr_impl<cmMakefile::DeferCommands,_std::default_delete<cmMakefile::DeferCommands>_>
              ._M_t.
              super__Tuple_impl<0UL,_cmMakefile::DeferCommands_*,_std::default_delete<cmMakefile::DeferCommands>_>
              .super__Head_base<0UL,_cmMakefile::DeferCommands_*,_false>._M_head_impl);
  std::__uniq_ptr_impl<cmMakefile::DeferCommands,_std::default_delete<cmMakefile::DeferCommands>_>::
  reset((__uniq_ptr_impl<cmMakefile::DeferCommands,_std::default_delete<cmMakefile::DeferCommands>_>
         *)&this->Defer,(pointer)0x0);
  if ((cmSystemTools::s_FatalErrorOccurred != false) ||
     (bVar8 = cmSystemTools::GetInterruptFlag(), bVar8)) {
    local_d8.ReportError = false;
  }
  std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::vector
            ((vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)local_238,
             &this->UnConfiguredDirectories);
  peVar15 = (element_type *)local_238._0_8_;
  if (local_238._0_8_ != local_238._8_8_) {
    do {
      cmStateSnapshot::InitializeFromParent_ForSubdirsCommand
                ((cmStateSnapshot *)((peVar15->Value).Name._M_dataplus._M_p + 0x2d0));
      ConfigureSubDirectory(this,(cmMakefile *)(peVar15->Value).Name._M_dataplus._M_p);
      peVar15 = (element_type *)&(peVar15->Value).Name._M_string_length;
    } while (peVar15 != (element_type *)local_238._8_8_);
  }
  AddCMakeDependFilesFromUser(this);
  if ((element_type *)local_238._0_8_ != (element_type *)0x0) {
    operator_delete((void *)local_238._0_8_,stack0xfffffffffffffdd8 - local_238._0_8_);
  }
LAB_001ea791:
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::~vector
            ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  BuildsystemFileScope::~BuildsystemFileScope(&local_d8);
  if ((undefined1 *)local_188._16_8_ != local_188 + 0x20) {
    operator_delete((void *)local_188._16_8_,(ulong)(local_188._32_8_ + 1));
  }
  return;
}

Assistant:

void cmMakefile::Configure()
{
  std::string currentStart = cmStrCat(
    this->StateSnapshot.GetDirectory().GetCurrentSource(), "/CMakeLists.txt");

  // Add the bottom of all backtraces within this directory.
  // We will never pop this scope because it should be available
  // for messages during the generate step too.
  this->Backtrace =
    this->Backtrace.Push(cmListFileContext::FromListFilePath(currentStart));

  BuildsystemFileScope scope(this);

  // make sure the CMakeFiles dir is there
  std::string filesDir = cmStrCat(
    this->StateSnapshot.GetDirectory().GetCurrentBinary(), "/CMakeFiles");
  cmSystemTools::MakeDirectory(filesDir);

  assert(cmSystemTools::FileExists(currentStart, true));
  this->AddDefinition("CMAKE_PARENT_LIST_FILE", currentStart);

#ifdef CMake_ENABLE_DEBUGGER
  if (this->GetCMakeInstance()->GetDebugAdapter() != nullptr) {
    this->GetCMakeInstance()->GetDebugAdapter()->OnBeginFileParse(
      this, currentStart);
  }
#endif

  cmListFile listFile;
  if (!listFile.ParseFile(currentStart.c_str(), this->GetMessenger(),
                          this->Backtrace)) {
#ifdef CMake_ENABLE_DEBUGGER
    if (this->GetCMakeInstance()->GetDebugAdapter() != nullptr) {
      this->GetCMakeInstance()->GetDebugAdapter()->OnEndFileParse();
    }
#endif

    return;
  }

#ifdef CMake_ENABLE_DEBUGGER
  if (this->GetCMakeInstance()->GetDebugAdapter() != nullptr) {
    this->GetCMakeInstance()->GetDebugAdapter()->OnEndFileParse();
    this->GetCMakeInstance()->GetDebugAdapter()->OnFileParsedSuccessfully(
      currentStart, listFile.Functions);
  }
#endif

  if (this->IsRootMakefile()) {
    bool hasVersion = false;
    // search for the right policy command
    for (cmListFileFunction const& func : listFile.Functions) {
      if (func.LowerCaseName() == "cmake_minimum_required"_s) {
        hasVersion = true;
        break;
      }
    }
    // if no policy command is found this is an error if they use any
    // non advanced functions or a lot of functions
    if (!hasVersion) {
      bool isProblem = true;
      if (listFile.Functions.size() < 30) {
        // the list of simple commands DO NOT ADD TO THIS LIST!!!!!
        // these commands must have backwards compatibility forever and
        // and that is a lot longer than your tiny mind can comprehend mortal
        std::set<std::string> allowedCommands;
        allowedCommands.insert("project");
        allowedCommands.insert("set");
        allowedCommands.insert("if");
        allowedCommands.insert("endif");
        allowedCommands.insert("else");
        allowedCommands.insert("elseif");
        allowedCommands.insert("add_executable");
        allowedCommands.insert("add_library");
        allowedCommands.insert("target_link_libraries");
        allowedCommands.insert("option");
        allowedCommands.insert("message");
        isProblem = false;
        for (cmListFileFunction const& func : listFile.Functions) {
          if (!cm::contains(allowedCommands, func.LowerCaseName())) {
            isProblem = true;
            break;
          }
        }
      }

      if (isProblem) {
        // Tell the top level cmMakefile to diagnose
        // this violation of CMP0000.
        this->SetCheckCMP0000(true);

        // Implicitly set the version for the user.
        cmPolicies::ApplyPolicyVersion(this, 2, 4, 0,
                                       cmPolicies::WarnCompat::Off);
      }
    }
    bool hasProject = false;
    // search for a project command
    for (cmListFileFunction const& func : listFile.Functions) {
      if (func.LowerCaseName() == "project"_s) {
        hasProject = true;
        break;
      }
    }
    // if no project command is found, add one
    if (!hasProject) {
      this->GetCMakeInstance()->IssueMessage(
        MessageType::AUTHOR_WARNING,
        "No project() command is present.  The top-level CMakeLists.txt "
        "file must contain a literal, direct call to the project() command.  "
        "Add a line of code such as\n"
        "  project(ProjectName)\n"
        "near the top of the file, but after cmake_minimum_required().\n"
        "CMake is pretending there is a \"project(Project)\" command on "
        "the first line.",
        this->Backtrace);
      cmListFileFunction project{ "project",
                                  0,
                                  0,
                                  { { "Project", cmListFileArgument::Unquoted,
                                      0 },
                                    { "__CMAKE_INJECTED_PROJECT_COMMAND__",
                                      cmListFileArgument::Unquoted, 0 } } };
      listFile.Functions.insert(listFile.Functions.begin(), project);
    }
  }

  this->Defer = cm::make_unique<DeferCommands>();
  this->RunListFile(listFile, currentStart, this->Defer.get());
  this->Defer.reset();
  if (cmSystemTools::GetFatalErrorOccurred()) {
    scope.Quiet();
  }

  // at the end handle any old style subdirs
  std::vector<cmMakefile*> subdirs = this->UnConfiguredDirectories;

  // for each subdir recurse
  auto sdi = subdirs.begin();
  for (; sdi != subdirs.end(); ++sdi) {
    (*sdi)->StateSnapshot.InitializeFromParent_ForSubdirsCommand();
    this->ConfigureSubDirectory(*sdi);
  }

  this->AddCMakeDependFilesFromUser();
}